

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator * __thiscall
QMultiHash<unsigned_long_long,QOpenGL2GradientCache::CacheInfo>::
emplace<QOpenGL2GradientCache::CacheInfo_const&>
          (iterator *__return_storage_ptr__,void *this,unsigned_long_long *key,CacheInfo *args)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  CacheInfo local_60;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *this;
  if (pDVar1 == (Data *)0x0) {
    local_60._0_8_ = (Data *)0x0;
    local_60.stops.d.d = *(Data **)((long)this + 8);
LAB_0013d15d:
    QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::detach
              ((QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *)this);
    emplace_helper<QOpenGL2GradientCache::CacheInfo_const&>(__return_storage_ptr__,this,key,args);
    QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::~QMultiHash
              ((QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *)&local_60);
  }
  else {
    if (1 < *(uint *)&pDVar1->ref) {
      local_60.stops.d.d = *(Data **)((long)this + 8);
      local_60._0_8_ = pDVar1;
      if (*(uint *)&pDVar1->ref != 0xffffffff) {
        LOCK();
        pDVar1->ref = (RefCount)(*(uint *)&pDVar1->ref + 1);
        UNLOCK();
      }
      goto LAB_0013d15d;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        emplace_helper<QOpenGL2GradientCache::CacheInfo_const&>
                  (__return_storage_ptr__,this,key,args);
        return __return_storage_ptr__;
      }
      goto LAB_0013d1ce;
    }
    QOpenGL2GradientCache::CacheInfo::CacheInfo(&local_60,args);
    QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::
    emplace_helper<QOpenGL2GradientCache::CacheInfo>
              (__return_storage_ptr__,
               (QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *)this,key,
               &local_60);
    QArrayDataPointer<std::pair<double,_QColor>_>::~QArrayDataPointer(&local_60.stops.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0013d1ce:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }